

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O1

void __thiscall Image_ExrIO_Test::~Image_ExrIO_Test(Image_ExrIO_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Image, ExrIO) {
    Point2i res(16, 49);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"R", "G", "B"}, ColorEncodingHandle::Linear);
        image.CopyRectIn({{0, 0}, res}, rgbPixels);

        // Check CopyRectIn()
        int offset = 0;
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x)
                for (int c = 0; c < 3; ++c, ++offset) {
                    if (format == PixelFormat::U256)
                        ;
                    else if (format == PixelFormat::Half)
                        ASSERT_EQ(Float(Half(rgbPixels[offset])),
                                  image.GetChannel({x, y}, c));
                    else if (format == PixelFormat::Float)
                        ASSERT_EQ(rgbPixels[offset], image.GetChannel({x, y}, c));
                }

        ImageMetadata metadata;
        metadata.colorSpace = RGBColorSpace::ACES2065_1;
        EXPECT_TRUE(image.Write("test.exr", metadata));

        ImageAndMetadata read = Image::Read("test.exr");

        EXPECT_EQ(image.Resolution(), read.image.Resolution());
        EXPECT_EQ(*RGBColorSpace::ACES2065_1, *read.metadata.GetColorSpace());
        if (!Is8Bit(format))
            EXPECT_EQ(read.image.Format(), format);

        ImageChannelDesc rgbDesc = read.image.GetChannelDesc({"R", "G", "B"});
        ASSERT_TRUE(bool(rgbDesc));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                ImageChannelValues v = read.image.GetChannels({x, y}, rgbDesc);
                for (int c = 0; c < 3; ++c)
                    if (Is8Bit(format))
                        EXPECT_EQ(Float(Half(image.GetChannel({x, y}, c))), v[c]);
                    else if (Is16Bit(format))
                        EXPECT_EQ(Float(Half(image.GetChannel({x, y}, c))), v[c]);
                    else
                        EXPECT_EQ(image.GetChannel({x, y}, c), v[c])
                            << " @ (" << x << ", " << y << ", ch " << c << ")";
            }

        EXPECT_EQ(0, remove("test.exr"));
    }
}